

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O3

void __thiscall Worker::operator()(Worker *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Worker *pWVar3;
  example *peVar4;
  vw *pvVar5;
  long *plVar6;
  ostream *poVar7;
  int iVar8;
  ezexample ex;
  int local_264;
  string local_260;
  pointer local_240;
  double local_238;
  Worker *local_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  ezexample local_1a8;
  
  pcVar2 = (this->vw_init_string->_M_dataplus)._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + this->vw_init_string->_M_string_length);
  pvVar5 = VW::initialize(&local_1c8,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  this->m_vw_parser = pvVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
    pvVar5 = this->m_vw_parser;
  }
  if (pvVar5 == (vw *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"cannot initialize vw parser");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(-1);
  }
  local_230 = this;
  if (runcount < 1) {
    local_264 = 0;
  }
  else {
    paVar1 = &local_260.field_2;
    iVar8 = 0;
    local_264 = 0;
    do {
      local_240 = (local_230->m_referenceValues->super__Vector_base<double,_std::allocator<double>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      ezexample::ezexample(&local_1a8,local_230->m_vw,false,local_230->m_vw_parser);
      ezexample::addns(&local_1a8,'s');
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"p^the_man","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^the","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^man","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      ezexample::addns(&local_1a8,'t');
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"p^le_homme","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^le","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^homme","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"1","");
      peVar4 = local_1a8.ec;
      pvVar5 = local_1a8.vw_par_ref;
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_1e8,local_1e8 + local_1e0);
      VW::parse_example_label(pvVar5,peVar4,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_1a8.example_changed_since_prediction = true;
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8);
      }
      local_238 = *local_240;
      ezexample::setup_for_predict(&local_1a8);
      if ((local_238 != (double)((local_1a8.ec)->pred).scalar) ||
         (NAN(local_238) || NAN((double)((local_1a8.ec)->pred).scalar))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"fail!",5);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_264 = local_264 + 1;
      }
      ezexample::remns(&local_1a8);
      ezexample::addns(&local_1a8,'t');
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"p^un_homme","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^un","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^homme","");
      ezexample::addf(&local_1a8,&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"1","");
      peVar4 = local_1a8.ec;
      pvVar5 = local_1a8.vw_par_ref;
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_208,local_208 + local_200);
      VW::parse_example_label(pvVar5,peVar4,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_1a8.example_changed_since_prediction = true;
      if (local_208 != local_1f8) {
        operator_delete(local_208);
      }
      local_238 = local_240[1];
      ezexample::setup_for_predict(&local_1a8);
      if ((local_238 != (double)((local_1a8.ec)->pred).scalar) ||
         (NAN(local_238) || NAN((double)((local_1a8.ec)->pred).scalar))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"fail!",5);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_264 = local_264 + 1;
      }
      ezexample::remns(&local_1a8);
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"p^un_homme","");
      ezexample::addf(&local_1a8,'t',&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^un","");
      ezexample::addf(&local_1a8,'t',&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"w^homme","");
      ezexample::addf(&local_1a8,'t',&local_260,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_228 = local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"1","");
      peVar4 = local_1a8.ec;
      pvVar5 = local_1a8.vw_par_ref;
      local_260._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_228,local_228 + local_220);
      VW::parse_example_label(pvVar5,peVar4,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      local_1a8.example_changed_since_prediction = true;
      if (local_228 != local_218) {
        operator_delete(local_228);
      }
      local_240 = (pointer)local_240[2];
      ezexample::setup_for_predict(&local_1a8);
      if (((double)local_240 != (double)((local_1a8.ec)->pred).scalar) ||
         (NAN((double)local_240) || NAN((double)((local_1a8.ec)->pred).scalar))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"fail!",5);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_264 = local_264 + 1;
      }
      ezexample::~ezexample(&local_1a8);
      iVar8 = iVar8 + 1;
    } while (iVar8 < runcount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error count = ",0xe);
  plVar6 = (long *)std::ostream::operator<<(&std::cerr,local_264);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  pWVar3 = local_230;
  VW::finish(local_230->m_vw_parser,true);
  pWVar3->m_vw_parser = (vw *)0x0;
  return;
}

Assistant:

void operator()()
  { m_vw_parser = VW::initialize(vw_init_string);
    if (m_vw_parser == NULL)
    { cerr << "cannot initialize vw parser" << endl;
      exit(-1);
    }

    int errorCount = 0;
    for (int i = 0; i < runcount; ++i)
    { vector<double>::iterator it = m_referenceValues.begin();
      ezexample ex(&m_vw, false, m_vw_parser);

      ex(vw_namespace('s'))
      ("p^the_man")
      ("w^the")
      ("w^man")
      (vw_namespace('t'))
      ("p^le_homme")
      ("w^le")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      //if (*it != pred) { cerr << "fail!" << endl; ++errorCount; }
      //VW::finish_example(m_vw, vec2);
      ++it;

      --ex;   // remove the most recent namespace
      ex(vw_namespace('t'))
      ("p^un_homme")
      ("w^un")
      ("w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      --ex;   // remove the most recent namespace
      // add features with explicit ns
      ex('t', "p^un_homme")
      ('t', "w^un")
      ('t', "w^homme");
      ex.set_label("1");
      if (*it != ex()) { cerr << "fail!" << endl; ++errorCount; }
      ++it;

      //cout << "."; cout.flush();
    }
    cerr << "error count = " << errorCount << endl;
    VW::finish(*m_vw_parser);
    m_vw_parser = NULL;
  }